

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmutex.h
# Opt level: O0

void __thiscall QBasicMutex::unlock(QBasicMutex *this)

{
  Type pQVar1;
  QMutexPrivate *pQVar2;
  QBasicAtomicPointer<QMutexPrivate> *in_RDI;
  QMutexPrivate *d;
  Type in_stack_ffffffffffffffd8;
  
  QtTsan::mutexPreUnlock(in_RDI,0);
  pQVar1 = QBasicAtomicPointer<QMutexPrivate>::fetchAndStoreRelease
                     (in_RDI,in_stack_ffffffffffffffd8);
  pQVar2 = dummyLocked();
  if (pQVar1 != pQVar2) {
    ::QBasicMutex::unlockInternalFutex(in_RDI);
  }
  QtTsan::mutexPostUnlock(in_RDI,0);
  return;
}

Assistant:

inline void unlock() noexcept {
        Q_ASSERT(d_ptr.loadRelaxed()); //mutex must be locked

        QtTsan::mutexPreUnlock(this, 0u);

        if constexpr (FutexAlwaysAvailable) {
            // we always unlock if we have futexes
            if (QMutexPrivate *d = d_ptr.fetchAndStoreRelease(nullptr); d != dummyLocked())
                unlockInternalFutex(d);     // was contended
        } else {
            // if we don't have futexes, we can only unlock if not contended
            if (QMutexPrivate *d; !d_ptr.testAndSetRelease(dummyLocked(), nullptr, d))
                unlockInternal(d);          // was contended
        }

        QtTsan::mutexPostUnlock(this, 0u);
    }